

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_paths.cpp
# Opt level: O3

void __thiscall ExchangePaths_ExportEmpty_Test::TestBody(ExchangePaths_ExportEmpty_Test *this)

{
  uint generation;
  string *lhs;
  database *this_00;
  char *pcVar1;
  string_mapping exported_strings;
  ostringstream exported_strings_stream;
  AssertHelper local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a0;
  ostringstream local_68;
  
  this_00 = &(this->super_ExchangePaths).export_db_;
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)4>
            ((string_mapping *)&local_a0,this_00);
  pstore::exchange::export_ns::ostream_base::ostream_base(&local_68.super_ostream_base,0x1000);
  local_68.str_._M_dataplus._M_p = (pointer)&local_68.str_.field_2;
  local_68.super_ostream_base._vptr_ostream_base = (_func_int **)&PTR__ostringstream_0023b498;
  local_68.str_._M_string_length = 0;
  local_68.str_.field_2._M_local_buf[0] = '\0';
  generation = pstore::database::get_current_revision(this_00);
  local_c0 = (undefined1  [8])&local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0);
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)4>
            (&local_68.super_ostream_base,(indent)0x0,this_00,generation,(string *)local_c0,
             (string_mapping *)&local_a0,false);
  if (local_c0 != (undefined1  [8])&local_b0) {
    operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
  }
  lhs = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_68);
  pcVar1 = "";
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
            ((internal *)local_c0,"exported_strings_stream.str ()","\"\"",lhs,(char (*) [1])0x1e6b3f
            );
  if (local_c0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = (local_b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
               ,0x5b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_a0._M_element_count;
  local_d0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_c0,"exported_strings.size ()","0U",(unsigned_long *)&local_c8,
             (uint *)&local_d0);
  if (local_c0[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
               ,0x5c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b8,local_b8);
  }
  pstore::exchange::export_ns::ostringstream::~ostringstream(&local_68);
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_a0);
  return;
}

Assistant:

TEST_F (ExchangePaths, ExportEmpty) {
    using namespace pstore::exchange::export_ns;
    static constexpr auto comments = false;
    string_mapping exported_strings{export_db_, path_index_tag ()};
    ostringstream exported_strings_stream;
    emit_strings<pstore::trailer::indices::path> (exported_strings_stream, indent{}, export_db_,
                                                  export_db_.get_current_revision (), "",
                                                  &exported_strings, comments);

    EXPECT_EQ (exported_strings_stream.str (), "");
    EXPECT_EQ (exported_strings.size (), 0U);
}